

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O1

void Cut_CellSuppMin(Cut_Cell_t *pCell)

{
  uint *pTruth;
  ushort *puVar1;
  int iVar2;
  bool bVar3;
  uint *puVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  uint nVars;
  byte bVar8;
  int iVar9;
  uint *pOut;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  uint *pIn;
  
  uVar10 = *(uint *)&pCell->field_0x20 & 0xf;
  if (uVar10 != 0) {
    pTruth = pCell->uTruth;
    pcVar12 = pCell->CanonPerm + (ulong)(uVar10 - 1) + 1;
    do {
      iVar5 = Extra_TruthVarInSupport(pTruth,*(uint *)&pCell->field_0x20 & 0xf,uVar10 - 1);
      if (iVar5 == 0) {
        nVars = *(uint *)&pCell->field_0x20 & 0xf;
        bVar8 = 1;
        if ((int)uVar10 < (int)nVars) {
          puVar4 = pTruth;
          pcVar11 = pcVar12;
          pIn = Cut_CellSuppMin::uTemp;
          iVar5 = -1;
          do {
            pOut = pIn;
            pIn = puVar4;
            Extra_TruthSwapAdjacentVars(pOut,pIn,nVars,uVar10 + iVar5);
            puVar1 = (ushort *)(pcVar11 + -1);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            nVars = *(uint *)&pCell->field_0x20 & 0xf;
            pcVar11 = pcVar11 + 1;
            iVar9 = iVar5 + 1;
            iVar2 = iVar5 + uVar10;
            puVar4 = pOut;
            iVar5 = iVar9;
          } while (iVar2 + 1 < (int)(nVars - 1));
          bVar8 = (byte)iVar9 & 1;
        }
        else {
          pIn = Cut_CellSuppMin::uTemp;
          pOut = pTruth;
        }
        if (bVar8 == 0) {
          uVar6 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
          if (nVars < 6) {
            uVar6 = 1;
          }
          lVar7 = uVar6 + 1;
          do {
            pIn[lVar7 + -2] = pOut[lVar7 + -2];
            lVar7 = lVar7 + -1;
          } while (1 < lVar7);
        }
        *(uint *)&pCell->field_0x20 =
             *(uint *)&pCell->field_0x20 & 0xfffffff0 | *(uint *)&pCell->field_0x20 - 1 & 0xf;
      }
      pcVar12 = pcVar12 + -1;
      bVar3 = 1 < (int)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void Cut_CellSuppMin( Cut_Cell_t * pCell )
{
    static unsigned uTemp[1<<(CUT_CELL_MVAR-5)];
    unsigned * pIn, * pOut, * pTemp;
    int i, k, Counter, Temp;

    // go backward through the support variables and remove redundant
    for ( k = pCell->nVars - 1; k >= 0; k-- )
        if ( !Extra_TruthVarInSupport(pCell->uTruth, pCell->nVars, k) )
        {
            // shift all the variables above this one
            Counter = 0;
            pIn = pCell->uTruth; pOut = uTemp;
            for ( i = k; i < (int)pCell->nVars - 1; i++ )
            {
                Extra_TruthSwapAdjacentVars( pOut, pIn, pCell->nVars, i );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
                // swap the support vars
                Temp = pCell->CanonPerm[i]; 
                pCell->CanonPerm[i] = pCell->CanonPerm[i+1];
                pCell->CanonPerm[i+1] = Temp;
                Counter++;
            }
            // return the function back into its place
            if ( Counter & 1 )
                Extra_TruthCopy( pOut, pIn, pCell->nVars );
            // remove one variable
            pCell->nVars--;
//            Extra_PrintBinary( stdout, pCell->uTruth, (1<<pCell->nVars) ); printf( "\n" );
        }
}